

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O3

bool __thiscall flatbuffers::SwiftGRPCGenerator::generate(SwiftGRPCGenerator *this)

{
  CodeWriter *this_00;
  ServiceDef *pSVar1;
  SymbolTable<flatbuffers::ServiceDef> *pSVar2;
  bool bVar3;
  File *file_00;
  long lVar4;
  string final_code;
  string filename;
  FlatBufFile file;
  long *local_f0;
  size_t local_e8;
  long local_e0 [2];
  string local_d0;
  string local_b0;
  undefined **local_90;
  Parser *local_88;
  string *local_80;
  undefined4 local_78;
  string local_70;
  string local_50;
  
  this_00 = &this->code_;
  CodeWriter::Clear(this_00);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"// Generated GRPC code for FlatBuffers swift!","");
  CodeWriter::operator+=(this_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  grpc_swift_generator::GenerateHeader_abi_cxx11_();
  CodeWriter::operator+=(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_88 = (this->super_BaseGenerator).parser_;
  local_80 = (this->super_BaseGenerator).file_name_;
  local_90 = &PTR__CommentHolder_003ea388;
  local_78 = 4;
  if (0 < (int)((ulong)((long)(local_88->services_).vec.
                              super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_88->services_).vec.
                             super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar4 = 0;
    do {
      pSVar2 = &local_88->services_;
      file_00 = (File *)operator_new(0x10);
      pSVar1 = (pSVar2->vec).
               super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar4];
      (file_00->super_CommentHolder)._vptr_CommentHolder =
           (_func_int **)&PTR__CommentHolder_003ea210;
      file_00[1].super_CommentHolder._vptr_CommentHolder = (_func_int **)pSVar1;
      grpc_swift_generator::Generate_abi_cxx11_
                (&local_d0,(grpc_swift_generator *)&local_90,file_00,
                 (Service *)&PTR__CommentHolder_003ea210);
      CodeWriter::operator+=(this_00,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      (*(file_00->super_CommentHolder)._vptr_CommentHolder[1])(file_00);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (int)((ulong)((long)(local_88->services_).vec.
                                         super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_88->services_).vec.
                                        super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  std::__cxx11::stringbuf::str();
  GeneratedFileName(&local_b0,(this->super_BaseGenerator).path_,
                    (this->super_BaseGenerator).file_name_);
  bVar3 = SaveFile(local_b0._M_dataplus._M_p,(char *)local_f0,local_e8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  return bVar3;
}

Assistant:

bool generate() {
    code_.Clear();
    code_ += "// Generated GRPC code for FlatBuffers swift!";
    code_ += grpc_swift_generator::GenerateHeader();
    FlatBufFile file(parser_, file_name_, FlatBufFile::kLanguageSwift);
    for (int i = 0; i < file.service_count(); i++) {
      auto service = file.service(i);
      code_ += grpc_swift_generator::Generate(&file, service.get());
    }
    const auto final_code = code_.ToString();
    const auto filename = GeneratedFileName(path_, file_name_);
    return SaveFile(filename.c_str(), final_code, false);
  }